

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexSeparableKernel::rotate(PtexSeparableKernel *this,int rotVal)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  switch(rotVal & 3) {
  case 0:
    goto switchD_004de392_caseD_0;
  case 1:
    flipU(this);
    break;
  case 2:
    flipU(this);
    flipV(this);
    goto LAB_004de3df;
  case 3:
    flipV(this);
  }
  this->res = (Res)((short)this->res << 8 | (ushort)this->res >> 8);
  iVar3 = this->u;
  iVar4 = this->uw;
  uVar1 = this->ku;
  uVar2 = this->kv;
  this->u = this->v;
  this->v = iVar3;
  this->uw = this->vw;
  this->vw = iVar4;
  auVar5._8_4_ = (int)uVar1;
  auVar5._0_8_ = uVar2;
  auVar5._12_4_ = (int)((ulong)uVar1 >> 0x20);
  this->ku = (float *)uVar2;
  this->kv = (float *)auVar5._8_8_;
LAB_004de3df:
  this->rot = rotVal + this->rot & 3;
switchD_004de392_caseD_0:
  return;
}

Assistant:

void rotate(int rotVal)
    {
        // rotate kernel 'rot' steps ccw
        switch (rotVal & 3) {
        default: return;
        case 1: flipU(); swapUV(); break;
        case 2: flipU(); flipV(); break;
        case 3: flipV(); swapUV(); break;
        }
        rot = (rot + rotVal)&3;
    }